

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  ostream *poVar2;
  int iVar3;
  allocator local_99;
  service srv;
  string local_90 [32];
  _Any_data local_70;
  code *local_60;
  code *local_58;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  cppcms::service::service(&srv,argc,argv);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<async_unit_test>();
  std::__cxx11::string::string(local_90,"/async",&local_99);
  cppcms::mount_point::mount_point((mount_point *)local_70._M_pod_data,local_90);
  cppcms::applications_pool::mount(uVar1,local_28,&local_70,1);
  cppcms::mount_point::~mount_point((mount_point *)local_70._M_pod_data);
  std::__cxx11::string::~string(local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<nonblocking_unit_test>();
  std::__cxx11::string::string(local_90,"/nonblocking",&local_99);
  cppcms::mount_point::mount_point((mount_point *)local_70._M_pod_data,local_90);
  iVar3 = 1;
  cppcms::applications_pool::mount(uVar1,local_38,&local_70,1);
  cppcms::mount_point::~mount_point((mount_point *)local_70._M_pod_data);
  std::__cxx11::string::~string(local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  std::__cxx11::string::string(local_90,"/sync",&local_99);
  cppcms::mount_point::mount_point((mount_point *)local_70._M_pod_data,local_90);
  cppcms::applications_pool::mount(uVar1,local_48,&local_70,0);
  cppcms::mount_point::~mount_point((mount_point *)local_70._M_pod_data);
  std::__cxx11::string::~string(local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  local_70._8_8_ = 0;
  local_58 = std::_Function_handler<void_(),_submitter>::_M_invoke;
  local_60 = std::_Function_handler<void_(),_submitter>::_M_manager;
  local_70._M_unused._0_8_ = (undefined8)(function *)&srv;
  cppcms::service::after_fork((function *)&srv);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  cppcms::service::run();
  cppcms::service::~service(&srv);
  if ((bad_count == 4) && (calls == 5)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Ok");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed bad_count = ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,bad_count);
    poVar2 = std::operator<<(poVar2," (exp 4) calls = ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,calls);
    poVar2 = std::operator<<(poVar2," (exp 5)");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return iVar3;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( 
			cppcms::create_pool<async_unit_test>(),
			cppcms::mount_point("/async"),
			cppcms::app::asynchronous);

		srv.applications_pool().mount(
			cppcms::create_pool<nonblocking_unit_test>(),
			cppcms::mount_point("/nonblocking"),
			cppcms::app::asynchronous);

		srv.applications_pool().mount( cppcms::create_pool<unit_test>(), cppcms::mount_point("/sync"));
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	if(bad_count != 4 || calls != 5) {
		std::cerr << "Failed bad_count = " << bad_count << " (exp 4) calls = " << calls << " (exp 5)"<< std::endl;
		return EXIT_FAILURE;
	}
	std::cout << "Ok" << std::endl;
	return EXIT_SUCCESS;
}